

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation::IfcMaterialDefinitionRepresentation
          (IfcMaterialDefinitionRepresentation *this)

{
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcMaterialDefinitionRepresentation";
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined1 **)
   &(this->super_IfcProductRepresentation).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x10 =
       &(this->super_IfcProductRepresentation).
        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x20;
  *(undefined8 *)
   &(this->super_IfcProductRepresentation).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x18 = 0;
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x20 = 0;
  (this->super_IfcProductRepresentation).field_0x30 = 0;
  (this->super_IfcProductRepresentation).Description.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcProductRepresentation).Description.ptr.field_2;
  (this->super_IfcProductRepresentation).Description.ptr._M_string_length = 0;
  (this->super_IfcProductRepresentation).Description.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcProductRepresentation).Description.have = false;
  (this->super_IfcProductRepresentation).Representations.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IfcProductRepresentation).Representations.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IfcProductRepresentation).Representations.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x78 = 0x8838e0;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x80 = 0;
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x8837c8;
  *(undefined8 *)&this->field_0x90 = 0x883818;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x78 = 0x8837f0;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x88 = 0;
  return;
}

Assistant:

IfcMaterialDefinitionRepresentation() : Object("IfcMaterialDefinitionRepresentation") {}